

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::LikeBindFunction
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  pointer puVar1;
  element_type *peVar2;
  int iVar3;
  pointer pEVar4;
  reference pvVar5;
  type expr;
  LogicalType *type;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *arg;
  pointer this_00;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *__range1;
  Value pattern_str;
  undefined1 local_a0 [48];
  Value local_70;
  
  this_00 = (arguments->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (arguments->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_a0._8_8_ = context;
  if (this_00 != puVar1) {
    do {
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_00);
      if ((pEVar4->return_type).id_ == VARCHAR) {
        pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this_00);
        StringType::GetCollation_abi_cxx11_
                  ((string *)(local_a0 + 0x30),(StringType *)&pEVar4->return_type,type);
        peVar2 = local_70.type_.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_70.type_._0_8_ !=
            &local_70.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
          operator_delete((void *)local_70.type_._0_8_);
        }
        if (peVar2 != (element_type *)0x0) goto LAB_010e9be7;
      }
      this_00 = this_00 + 1;
    } while (this_00 != puVar1);
  }
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar5);
  iVar3 = (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar4);
  if ((char)iVar3 == '\0') {
LAB_010e9be7:
    *(undefined8 *)this = 0;
  }
  else {
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,1);
    expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (pvVar5);
    ExpressionExecutor::EvaluateScalar
              ((Value *)(local_a0 + 0x30),(ClientContext *)local_a0._8_8_,expr,false);
    Value::ToString_abi_cxx11_((string *)(local_a0 + 0x10),(Value *)(local_a0 + 0x30));
    LikeMatcher::CreateLikeMatcher((LikeMatcher *)local_a0,(string *)(local_a0 + 0x10),'\0');
    *(undefined8 *)this = local_a0._0_8_;
    local_a0._0_8_ = (_func_int **)0x0;
    if ((undefined1 *)local_a0._16_8_ != local_a0 + 0x20) {
      operator_delete((void *)local_a0._16_8_);
    }
    Value::~Value((Value *)(local_a0 + 0x30));
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> LikeBindFunction(ClientContext &context, ScalarFunction &bound_function,
                                                 vector<unique_ptr<Expression>> &arguments) {
	// pattern is the second argument. If its constant, we can already prepare the pattern and store it for later.
	D_ASSERT(arguments.size() == 2 || arguments.size() == 3);
	for (auto &arg : arguments) {
		if (arg->return_type.id() == LogicalTypeId::VARCHAR && !StringType::GetCollation(arg->return_type).empty()) {
			return nullptr;
		}
	}
	if (arguments[1]->IsFoldable()) {
		Value pattern_str = ExpressionExecutor::EvaluateScalar(context, *arguments[1]);
		return LikeMatcher::CreateLikeMatcher(pattern_str.ToString());
	}
	return nullptr;
}